

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

BinaryExpr<const_type_safe::nullopt_t_&,_const_type_safe::basic_optional<type_safe::direct_optional_storage<int>_>_&>
* __thiscall
Catch::ExprLhs<type_safe::nullopt_t_const&>::operator<=
          (BinaryExpr<const_type_safe::nullopt_t_&,_const_type_safe::basic_optional<type_safe::direct_optional_storage<int>_>_&>
           *__return_storage_ptr__,ExprLhs<type_safe::nullopt_t_const&> *this,
          basic_optional<type_safe::direct_optional_storage<int>_> *rhs)

{
  nullopt_t *lhs;
  bool comparisonResult;
  StringRef local_38;
  basic_optional<type_safe::direct_optional_storage<int>_> *local_20;
  basic_optional<type_safe::direct_optional_storage<int>_> *rhs_local;
  ExprLhs<const_type_safe::nullopt_t_&> *this_local;
  
  local_20 = rhs;
  rhs_local = (basic_optional<type_safe::direct_optional_storage<int>_> *)this;
  this_local = (ExprLhs<const_type_safe::nullopt_t_&> *)__return_storage_ptr__;
  comparisonResult = type_safe::operator<=(rhs);
  lhs = *(nullopt_t **)this;
  StringRef::StringRef(&local_38,"<=");
  BinaryExpr<const_type_safe::nullopt_t_&,_const_type_safe::basic_optional<type_safe::direct_optional_storage<int>_>_&>
  ::BinaryExpr(__return_storage_ptr__,comparisonResult,lhs,local_38,local_20);
  return __return_storage_ptr__;
}

Assistant:

auto operator <= ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { static_cast<bool>(m_lhs <= rhs), m_lhs, "<=", rhs };
        }